

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field_operators.cpp
# Opt level: O0

void test_z5_standart_field_properties<Gudhi::persistence_fields::Zp_field_operators<unsigned_int,void>>
               (Zp_field_operators<unsigned_int,_void> *op)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  Characteristic *pCVar4;
  undefined4 local_448;
  Element_conflict local_444;
  basic_cstring<const_char> local_440;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_430;
  basic_cstring<const_char> local_408;
  basic_cstring<const_char> local_3f8;
  undefined4 local_3e8;
  Element_conflict local_3e4;
  basic_cstring<const_char> local_3e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3d0;
  basic_cstring<const_char> local_3a8;
  basic_cstring<const_char> local_398;
  undefined4 local_384;
  basic_cstring<const_char> local_380;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_370;
  basic_cstring<const_char> local_348;
  basic_cstring<const_char> local_338;
  undefined4 local_328;
  Element_conflict local_324;
  basic_cstring<const_char> local_320;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_310;
  basic_cstring<const_char> local_2e8;
  basic_cstring<const_char> local_2d8;
  undefined4 local_2c8;
  Element_conflict local_2c4;
  basic_cstring<const_char> local_2c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2b0;
  basic_cstring<const_char> local_288;
  basic_cstring<const_char> local_278;
  undefined4 local_268;
  Element_conflict local_264;
  basic_cstring<const_char> local_260;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_250;
  basic_cstring<const_char> local_228;
  basic_cstring<const_char> local_218;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1e8;
  uint local_1c8 [2];
  pair<unsigned_int,_unsigned_int> local_1c0;
  pair<unsigned_int,_unsigned_int> local_1b8;
  assertion_result local_1b0;
  basic_cstring<const_char> local_198;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  basic_cstring<const_char> local_168;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_158;
  uint local_138 [2];
  pair<unsigned_int,_unsigned_int> local_130;
  pair<unsigned_int,_unsigned_int> local_128;
  assertion_result local_120;
  basic_cstring<const_char> local_108;
  basic_cstring<const_char> local_f8;
  undefined4 local_e8;
  Element_conflict local_e4;
  basic_cstring<const_char> local_e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d0;
  basic_cstring<const_char> local_a8;
  basic_cstring<const_char> local_98;
  undefined4 local_84;
  Element_conflict local_80 [4];
  basic_cstring<const_char> local_70;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_60;
  basic_cstring<const_char> local_38;
  basic_cstring<const_char> local_28;
  Element_conflict local_18;
  Element_conflict local_14;
  uint z52;
  uint z51;
  Zp_field_operators<unsigned_int,_void> *op_local;
  
  local_14 = 7;
  local_18 = 3;
  _z52 = op;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_38);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_28,0x149,&local_38);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_60,plVar3,(char (*) [1])0x11f018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    local_80[0] = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::get_inverse
                            (_z52,local_14);
    local_84 = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_60,&local_70,0x149,1,2,local_80,"op.get_inverse(z51)",&local_84,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_60);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_98,0x14a,&local_a8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d0,plVar3,(char (*) [1])0x11f018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    local_e4 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::get_inverse
                         (_z52,local_18);
    local_e8 = 2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_d0,&local_e0,0x14a,1,2,&local_e4,"op.get_inverse(z52)",&local_e8,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_108);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f8,0x14b,&local_108);
    local_128 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::
                get_partial_inverse(_z52,local_14,0x23);
    local_138[1] = 3;
    local_138[0] = 0x23;
    local_130 = std::make_pair<unsigned_int,unsigned_int>(local_138 + 1,local_138);
    bVar2 = std::operator==(&local_128,&local_130);
    boost::test_tools::assertion_result::assertion_result(&local_120,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_168,"op.get_partial_inverse(z51, 35) == std::make_pair(3u, 35u)",0x3a);
    boost::unit_test::operator<<(&local_158,plVar3,&local_168);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    boost::test_tools::tt_detail::report_assertion(&local_120,&local_158,&local_178,0x14b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_158);
    boost::test_tools::assertion_result::~assertion_result(&local_120);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_198);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_188,0x14c,&local_198);
    local_1b8 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::
                get_partial_inverse(_z52,local_18,0x23);
    local_1c8[1] = 2;
    local_1c8[0] = 0x23;
    local_1c0 = std::make_pair<unsigned_int,unsigned_int>(local_1c8 + 1,local_1c8);
    bVar2 = std::operator==(&local_1b8,&local_1c0);
    boost::test_tools::assertion_result::assertion_result(&local_1b0,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,"op.get_partial_inverse(z52, 35) == std::make_pair(2u, 35u)",0x3a);
    boost::unit_test::operator<<(&local_1e8,plVar3,&local_1f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    boost::test_tools::tt_detail::report_assertion(&local_1b0,&local_1e8,&local_208,0x14c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1e8);
    boost::test_tools::assertion_result::~assertion_result(&local_1b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_228);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_218,0x14e,&local_228);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_250,plVar3,(char (*) [1])0x11f018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    local_264 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::
                get_additive_identity();
    local_268 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_250,&local_260,0x14e,1,2,&local_264,"op.get_additive_identity()",&local_268,
               "0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_250);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_288);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_278,0x150,&local_288);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2b0,plVar3,(char (*) [1])0x11f018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    local_2c4 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::
                get_multiplicative_identity();
    local_2c8 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_2b0,&local_2c0,0x150,1,2,&local_2c4,"op.get_multiplicative_identity()",
               &local_2c8,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_2b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2d8,0x151,&local_2e8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_310,plVar3,(char (*) [1])0x11f018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_320,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    local_324 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::
                get_partial_multiplicative_identity(0x23);
    local_328 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_310,&local_320,0x151,1,2,&local_324,
               "op.get_partial_multiplicative_identity(35)",&local_328,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_310);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_348);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_338,0x153,&local_348);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_370,plVar3,(char (*) [1])0x11f018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    pCVar4 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::get_characteristic
                       (_z52);
    local_384 = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_370,&local_380,0x153,1,2,pCVar4,"op.get_characteristic()",&local_384,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_370);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_398,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_398,0x155,&local_3a8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3d0,plVar3,(char (*) [1])0x11f018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    local_3e4 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::get_value
                          (_z52,local_14);
    local_3e8 = 2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_3d0,&local_3e0,0x155,1,2,&local_3e4,"op.get_value(z51)",&local_3e8,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_408);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3f8,0x156,&local_408);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_430,plVar3,(char (*) [1])0x11f018);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_440,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
               ,0x8d);
    local_444 = Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::get_value
                          (_z52,local_18);
    local_448 = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_430,&local_440,0x156,1,2,&local_444,"op.get_value(z52)",&local_448,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_430);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

void test_z5_standart_field_properties(Z5& op) {
  unsigned int z51 = 7;
  unsigned int z52 = 3;

  BOOST_CHECK_EQUAL(op.get_inverse(z51), 3);
  BOOST_CHECK_EQUAL(op.get_inverse(z52), 2);
  BOOST_CHECK(op.get_partial_inverse(z51, 35) == std::make_pair(3u, 35u));
  BOOST_CHECK(op.get_partial_inverse(z52, 35) == std::make_pair(2u, 35u));

  BOOST_CHECK_EQUAL(op.get_additive_identity(), 0);

  BOOST_CHECK_EQUAL(op.get_multiplicative_identity(), 1);
  BOOST_CHECK_EQUAL(op.get_partial_multiplicative_identity(35), 1);

  BOOST_CHECK_EQUAL(op.get_characteristic(), 5);

  BOOST_CHECK_EQUAL(op.get_value(z51), 2);
  BOOST_CHECK_EQUAL(op.get_value(z52), 3);
}